

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RandSequenceStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RandSequenceStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4,Token *args_5,SyntaxList<slang::syntax::ProductionSyntax> *args_6,
          Token *args_7)

{
  Token randsequence;
  Token closeParen;
  Token endsequence;
  RandSequenceStatementSyntax *productions;
  Token *in_RCX;
  Info *in_RDX;
  Token *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000018;
  size_t in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  BumpAllocator *in_stack_ffffffffffffff48;
  
  productions = (RandSequenceStatementSyntax *)
                allocate(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff38);
  randsequence.info = (Info *)*in_R9;
  randsequence._0_8_ = in_stack_00000008[1];
  closeParen.info = (Info *)in_R8;
  closeParen._0_8_ = in_R9;
  endsequence.info = in_RDX;
  endsequence._0_8_ = in_RCX;
  slang::syntax::RandSequenceStatementSyntax::RandSequenceStatementSyntax
            ((RandSequenceStatementSyntax *)*in_stack_00000008,
             (NamedLabelSyntax *)in_stack_00000018[1],
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_stack_00000018,randsequence,
             *in_R8,*in_RCX,closeParen,(SyntaxList<slang::syntax::ProductionSyntax> *)productions,
             endsequence);
  return productions;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }